

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::emitInstance(SemanticParser *this,SP *pbrtInstance)

{
  long lVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  element_type *peVar7;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SP SVar8;
  __shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::make_shared<pbrt::Instance>();
  lVar1 = *in_RDX;
  peVar2 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar3 = *(pointer *)(lVar1 + 0x10);
  peVar4 = *(element_type **)(lVar1 + 0x18);
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x20);
  peVar6 = *(element_type **)(lVar1 + 0x28);
  peVar7 = *(element_type **)(lVar1 + 0x38);
  (peVar2->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x30);
  (peVar2->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar7;
  (peVar2->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  (peVar2->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  *(pointer *)
   ((long)&(peVar2->cameras).
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = psVar3;
  (peVar2->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  std::__shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,(__shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2> *)*in_RDX
            );
  findOrEmitObject((SemanticParser *)&stack0xffffffffffffffd8,(SP *)pbrtInstance);
  std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
             &((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              cameras,(__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
                      &stack0xffffffffffffffd8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  SVar8.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar8.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SP)SVar8.super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Instance::SP SemanticParser::emitInstance(pbrt::syntactic::Object::Instance::SP pbrtInstance)
  {
    Instance::SP ourInstance
      = std::make_shared<Instance>();
    ourInstance->xfm    = (const affine3f&)pbrtInstance->xfm.atStart;
    ourInstance->object = findOrEmitObject(pbrtInstance->object);
    return ourInstance;
  }